

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall CGL::SceneObjects::BVHAccel::~BVHAccel(BVHAccel *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  BVHNode *unaff_retaddr;
  
  *in_RDI = &PTR_get_bbox_00140b18;
  if ((in_RDI[9] != 0) && (pvVar1 = (void *)in_RDI[9], pvVar1 != (void *)0x0)) {
    BVHNode::~BVHNode(unaff_retaddr);
    operator_delete(pvVar1);
  }
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  clear((vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *)
        0x120d4d);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  ~vector((vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *
          )unaff_retaddr);
  Aggregate::~Aggregate((Aggregate *)0x120d65);
  return;
}

Assistant:

BVHAccel::~BVHAccel() {
  if (root)
    delete root;
  primitives.clear();
}